

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_permute_rows(m256v *M,int *rowperm)

{
  int n_col;
  uint8_t *memory;
  uint8_t auStack_70 [8];
  long local_68;
  int local_5c;
  int local_58;
  int e_next;
  int e;
  int i_1;
  m256v rowbuf_mat;
  unsigned_long __vla_expr1;
  int i;
  unsigned_long __vla_expr0;
  int *rowperm_local;
  m256v *M_local;
  
  local_68 = (long)&local_68 - ((ulong)(uint)M->n_row + 0xf & 0xfffffffffffffff0);
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < M->n_row;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    *(undefined1 *)(local_68 + __vla_expr1._4_4_) = 0;
  }
  rowbuf_mat.e = (uint8_t *)(ulong)(uint)M->n_col;
  memory = (uint8_t *)(local_68 - ((ulong)(rowbuf_mat.e + 0xf) & 0xfffffffffffffff0));
  n_col = M->n_col;
  builtin_memcpy(memory + -8,"f;\x10",4);
  memory[-4] = '\0';
  memory[-3] = '\0';
  memory[-2] = '\0';
  memory[-1] = '\0';
  m256v_make((m256v *)&e,1,n_col,memory);
  for (e_next = 0; e_next < M->n_row; e_next = e_next + 1) {
    if (*(char *)(local_68 + e_next) == '\0') {
      if (rowperm[e_next] == e_next) {
        *(undefined1 *)(local_68 + e_next) = 1;
      }
      else {
        memory[-8] = 0xc2;
        memory[-7] = ';';
        memory[-6] = '\x10';
        memory[-5] = '\0';
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_copy_row(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),*(m256v **)(memory + 0x18)
                       ,*(int *)(memory + 0x14));
        local_58 = e_next;
        for (local_5c = rowperm[e_next]; local_5c != e_next; local_5c = rowperm[local_5c]) {
          *(undefined1 *)(local_68 + local_5c) = 1;
          memory[-8] = 0xfd;
          memory[-7] = ';';
          memory[-6] = '\x10';
          memory[-5] = '\0';
          memory[-4] = '\0';
          memory[-3] = '\0';
          memory[-2] = '\0';
          memory[-1] = '\0';
          m256v_copy_row(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),
                         *(m256v **)(memory + 0x18),*(int *)(memory + 0x14));
          local_58 = local_5c;
        }
        *(undefined1 *)(local_68 + e_next) = 1;
        builtin_memcpy(memory + -8,"1<\x10",4);
        memory[-4] = '\0';
        memory[-3] = '\0';
        memory[-2] = '\0';
        memory[-1] = '\0';
        m256v_copy_row(*(m256v **)(memory + 0x28),*(int *)(memory + 0x24),*(m256v **)(memory + 0x18)
                       ,*(int *)(memory + 0x14));
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}